

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O3

void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result,uint8_t *scalar,uint64_t *q1)

{
  uint64_t *a;
  uint64_t b0;
  uint64_t yi_2;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t t4;
  ulong uVar4;
  ulong uVar5;
  uint64_t yi;
  ulong uVar6;
  bool bVar7;
  uint64_t *tmp5;
  ulong local_460;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  ulong local_440;
  ulong local_438;
  ulong local_430;
  ulong local_428;
  ulong local_420;
  ulong local_418;
  ulong local_410;
  ulong local_408;
  ulong local_400;
  ulong local_3f8;
  ulong local_3f0;
  uint64_t local_3e8;
  long lStack_3e0;
  long local_3d8;
  long lStack_3d0;
  long local_3c8;
  ulong local_3c0;
  long local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  ulong local_398;
  uint64_t uStack_390;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong local_370;
  long lStack_368;
  long local_360;
  long lStack_358;
  long local_350;
  uint64_t local_348;
  long lStack_340;
  long local_338;
  long lStack_330;
  long local_328;
  uint64_t local_320;
  long lStack_318;
  long local_310;
  long lStack_308;
  long local_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  uint64_t local_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  uint64_t local_2a8;
  ulong local_2a0;
  ulong uStack_298;
  ulong local_290;
  ulong uStack_288;
  ulong local_280;
  ulong uStack_278;
  ulong local_270;
  ulong uStack_268;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint64_t *local_78;
  ulong *local_70;
  uint64_t *local_68;
  uint8_t *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_78 = result;
  local_60 = scalar;
  memset(&local_2f8,0,0x280);
  local_2d0 = 1;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2a8 = 1;
  local_2a0 = 0;
  uStack_298 = 0;
  local_290 = 0;
  uStack_288 = 0;
  local_280 = 0;
  uStack_278 = 0;
  local_270 = 0;
  uStack_268 = 0;
  local_260 = 0;
  local_70 = &local_258;
  memcpy(&local_258,q1,0xa0);
  local_68 = &local_348;
  local_3f0 = local_2c8;
  local_3f8 = uStack_2c0;
  local_400 = local_2b8;
  local_408 = uStack_2b0;
  local_438 = local_230;
  local_430 = local_228;
  local_428 = local_220;
  local_420 = local_218;
  local_440 = local_210;
  local_410 = local_2a8;
  local_418 = local_2a0;
  local_448 = uStack_298;
  local_458 = local_290;
  local_460 = uStack_288;
  local_450 = local_208;
  uVar1 = 0xff;
  do {
    local_38 = -(ulong)((local_60[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0);
    uVar2 = (local_258 ^ local_2f8) & local_38;
    local_2f8 = local_2f8 ^ uVar2;
    local_258 = uVar2 ^ local_258;
    uVar2 = (local_250 ^ uStack_2f0) & local_38;
    uStack_2f0 = uStack_2f0 ^ uVar2;
    local_250 = uVar2 ^ local_250;
    uVar2 = (local_248 ^ local_2e8) & local_38;
    local_2e8 = local_2e8 ^ uVar2;
    local_248 = uVar2 ^ local_248;
    uVar2 = (local_240 ^ uStack_2e0) & local_38;
    uStack_2e0 = uStack_2e0 ^ uVar2;
    local_240 = uVar2 ^ local_240;
    uVar2 = (local_238 ^ local_2d8) & local_38;
    local_2d8 = local_2d8 ^ uVar2;
    local_238 = uVar2 ^ local_238;
    local_230 = (local_438 ^ local_2d0) & local_38;
    uVar6 = local_2d0 ^ local_230;
    local_230 = local_230 ^ local_438;
    local_228 = (local_430 ^ local_3f0) & local_38;
    local_2c8 = local_3f0 ^ local_228;
    local_228 = local_228 ^ local_430;
    local_220 = (local_428 ^ local_3f8) & local_38;
    uStack_2c0 = local_3f8 ^ local_220;
    local_220 = local_220 ^ local_428;
    local_218 = (local_420 ^ local_400) & local_38;
    local_2b8 = local_400 ^ local_218;
    local_218 = local_218 ^ local_420;
    local_210 = (local_440 ^ local_408) & local_38;
    uStack_2b0 = local_408 ^ local_210;
    local_210 = local_210 ^ local_440;
    local_208 = (local_450 ^ local_410) & local_38;
    local_2a8 = local_410 ^ local_208;
    local_208 = local_208 ^ local_450;
    uVar2 = (local_200 ^ local_418) & local_38;
    local_2a0 = local_418 ^ uVar2;
    local_200 = uVar2 ^ local_200;
    uVar2 = (local_1f8 ^ local_448) & local_38;
    uStack_298 = local_448 ^ uVar2;
    local_1f8 = uVar2 ^ local_1f8;
    uVar2 = (local_1f0 ^ local_458) & local_38;
    local_290 = local_458 ^ uVar2;
    local_1f0 = uVar2 ^ local_1f0;
    uVar2 = (local_1e8 ^ local_460) & local_38;
    uStack_288 = local_460 ^ uVar2;
    local_1e8 = uVar2 ^ local_1e8;
    uVar2 = (local_1e0 ^ local_280) & local_38;
    local_280 = local_280 ^ uVar2;
    local_1e0 = uVar2 ^ local_1e0;
    uVar2 = (local_1d8 ^ uStack_278) & local_38;
    uStack_278 = uStack_278 ^ uVar2;
    local_1d8 = uVar2 ^ local_1d8;
    uVar2 = (local_1d0 ^ local_270) & local_38;
    local_270 = local_270 ^ uVar2;
    local_1d0 = uVar2 ^ local_1d0;
    uVar2 = (local_1c8 ^ uStack_268) & local_38;
    uStack_268 = uStack_268 ^ uVar2;
    local_1c8 = uVar2 ^ local_1c8;
    uVar2 = (local_1c0 ^ local_260) & local_38;
    local_260 = local_260 ^ uVar2;
    local_1c0 = uVar2 ^ local_1c0;
    local_2d0 = uVar6;
    memset(&local_3e8,0,0xf0);
    Hacl_Bignum25519_fsquare(&local_3e8,&local_2f8);
    Hacl_Bignum25519_fsquare(&local_3c0,&local_2d0);
    Hacl_Bignum25519_fsquare(&local_398,&local_2a8);
    a = local_68;
    local_350 = local_378 * 2;
    local_370 = local_398 * 2;
    lStack_368 = uStack_390 * 2;
    local_360 = local_388 * 2;
    lStack_358 = uStack_380 * 2;
    uVar2 = (local_3c0 + local_3e8 >> 0x33) + local_3b8 + lStack_3e0;
    local_388 = (uVar2 >> 0x33) + local_3b0 + local_3d8;
    uStack_380 = (local_388 >> 0x33) + local_3a8 + lStack_3d0;
    local_388 = local_388 & 0x7ffffffffffff;
    uVar3 = (uStack_380 >> 0x33) + local_3a0 + local_3c8;
    uStack_380 = uStack_380 & 0x7ffffffffffff;
    local_378 = uVar3 & 0x7ffffffffffff;
    uVar3 = (uVar3 >> 0x33) * 0x13 + (local_3c0 + local_3e8 & 0x7ffffffffffff);
    local_398 = uVar3 & 0x7ffffffffffff;
    uStack_390 = (uVar3 >> 0x33) + (uVar2 & 0x7ffffffffffff);
    local_68[4] = local_2d8;
    uVar4 = uStack_2e0;
    uVar3 = uStack_2f0;
    uVar2 = local_2f8;
    a[2] = local_2e8;
    a[3] = uVar4;
    *a = uVar2;
    a[1] = uVar3;
    local_348 = local_348 + uVar6;
    lStack_340 = lStack_340 + local_2c8;
    local_338 = local_338 + uStack_2c0;
    lStack_330 = lStack_330 + local_2b8;
    local_328 = local_328 + uStack_2b0;
    Hacl_Bignum25519_fsquare(&local_320,a);
    a[4] = local_378;
    a[2] = local_388;
    a[3] = uStack_380;
    *a = local_398;
    a[1] = uStack_390;
    local_320 = (local_348 - local_320) + 0x3fffffffffff68;
    lStack_318 = (lStack_340 - lStack_318) + 0x3ffffffffffff8;
    local_310 = (local_338 - local_310) + 0x3ffffffffffff8;
    lStack_308 = (lStack_330 - lStack_308) + 0x3ffffffffffff8;
    local_300 = (local_328 + 0x3ffffffffffff8) - local_300;
    uVar2 = (local_3e8 - local_3c0) + 0x3fffffffffff68;
    uVar4 = (uVar2 >> 0x33) + ((lStack_3e0 + 0x3ffffffffffff8) - local_3b8);
    local_3b0 = (uVar4 >> 0x33) + ((local_3d8 + 0x3ffffffffffff8) - local_3b0);
    local_3a8 = (local_3b0 >> 0x33) + ((lStack_3d0 + 0x3ffffffffffff8) - local_3a8);
    local_3b0 = local_3b0 & 0x7ffffffffffff;
    uVar3 = (local_3a8 >> 0x33) + ((local_3c8 + 0x3ffffffffffff8) - local_3a0);
    local_3a8 = local_3a8 & 0x7ffffffffffff;
    local_3a0 = uVar3 & 0x7ffffffffffff;
    uVar2 = (uVar3 >> 0x33) * 0x13 + (uVar2 & 0x7ffffffffffff);
    local_3c0 = uVar2 & 0x7ffffffffffff;
    local_3b8 = (uVar2 >> 0x33) + (uVar4 & 0x7ffffffffffff);
    uVar2 = (local_370 >> 0x33) + lStack_368;
    uVar3 = (uVar2 >> 0x33) + local_360;
    uVar4 = (uVar3 >> 0x33) + lStack_358;
    uVar6 = (uVar4 >> 0x33) + local_350;
    uVar5 = (uVar6 >> 0x33) * 0x13 + (local_370 & 0x7ffffffffffff);
    local_370 = (uVar5 & 0x7ffffffffffff) + local_3c0;
    lStack_368 = (uVar2 & 0x7ffffffffffff) + local_3b8 + (uVar5 >> 0x33);
    local_360 = (uVar3 & 0x7ffffffffffff) + local_3b0;
    lStack_358 = (uVar4 & 0x7ffffffffffff) + local_3a8;
    local_350 = (uVar6 & 0x7ffffffffffff) + local_3a0;
    Hacl_Bignum25519_fmul(&local_1b8,&local_370,&local_320);
    Hacl_Bignum25519_fmul(&local_190,&local_3c0,&local_398);
    Hacl_Bignum25519_fmul(&local_140,&local_398,&local_320);
    Hacl_Bignum25519_fmul(&local_168,&local_370,&local_3c0);
    Hacl_Impl_Ed25519_PointAdd_point_add(&local_118,&local_2f8,local_70);
    local_258 = (local_118 ^ local_1b8) & local_38;
    local_250 = (local_110 ^ local_1b0) & local_38;
    local_248 = (local_108 ^ local_1a8) & local_38;
    local_240 = (local_100 ^ local_1a0) & local_38;
    local_2f8 = local_1b8 ^ local_258;
    local_258 = local_258 ^ local_118;
    local_238 = (local_f8 ^ local_198) & local_38;
    uStack_2f0 = local_1b0 ^ local_250;
    local_250 = local_250 ^ local_110;
    local_2e8 = local_1a8 ^ local_248;
    local_248 = local_248 ^ local_108;
    uStack_2e0 = local_1a0 ^ local_240;
    local_240 = local_240 ^ local_100;
    local_2d8 = local_198 ^ local_238;
    local_238 = local_238 ^ local_f8;
    local_438 = (local_f0 ^ local_190) & local_38;
    local_430 = (local_e8 ^ local_188) & local_38;
    local_428 = (local_e0 ^ local_180) & local_38;
    local_420 = (local_d8 ^ local_178) & local_38;
    local_2d0 = local_190 ^ local_438;
    local_438 = local_438 ^ local_f0;
    local_440 = (local_d0 ^ local_170) & local_38;
    local_3f0 = local_188 ^ local_430;
    local_430 = local_430 ^ local_e8;
    local_3f8 = local_180 ^ local_428;
    local_428 = local_428 ^ local_e0;
    local_400 = local_178 ^ local_420;
    local_420 = local_420 ^ local_d8;
    local_408 = local_170 ^ local_440;
    local_440 = local_440 ^ local_d0;
    local_450 = (local_c8 ^ local_168) & local_38;
    local_410 = local_168 ^ local_450;
    local_450 = local_450 ^ local_c8;
    local_200 = (local_c0 ^ local_160) & local_38;
    local_418 = local_160 ^ local_200;
    local_200 = local_200 ^ local_c0;
    local_1f8 = (local_b8 ^ local_158) & local_38;
    local_448 = local_158 ^ local_1f8;
    local_1f8 = local_1f8 ^ local_b8;
    local_1f0 = (local_b0 ^ local_150) & local_38;
    local_458 = local_150 ^ local_1f0;
    local_1f0 = local_1f0 ^ local_b0;
    local_1e8 = (local_a8 ^ local_148) & local_38;
    local_460 = local_148 ^ local_1e8;
    local_1e8 = local_1e8 ^ local_a8;
    local_48 = local_a0;
    local_1e0 = (local_a0 ^ local_140) & local_38;
    local_50 = local_98;
    local_1d8 = (local_98 ^ local_138) & local_38;
    local_58 = local_90;
    local_1d0 = (local_90 ^ local_130) & local_38;
    local_1c8 = (local_88 ^ local_128) & local_38;
    local_1c0 = (local_80 ^ local_120) & local_38;
    local_280 = local_140 ^ local_1e0;
    local_1e0 = local_1e0 ^ local_a0;
    uStack_278 = local_138 ^ local_1d8;
    local_1d8 = local_1d8 ^ local_98;
    local_270 = local_130 ^ local_1d0;
    local_1d0 = local_1d0 ^ local_90;
    uStack_268 = local_128 ^ local_1c8;
    local_1c8 = local_1c8 ^ local_88;
    local_260 = local_120 ^ local_1c0;
    local_1c0 = local_1c0 ^ local_80;
    bVar7 = uVar1 != 0;
    uVar1 = uVar1 - 1;
    local_40 = local_2d0;
  } while (bVar7);
  local_2a8 = local_410;
  local_230 = local_438;
  local_228 = local_430;
  local_220 = local_428;
  local_218 = local_420;
  local_210 = local_440;
  local_208 = local_450;
  local_2c8 = local_3f0;
  uStack_2c0 = local_3f8;
  local_2b8 = local_400;
  uStack_2b0 = local_408;
  local_2a0 = local_418;
  uStack_298 = local_448;
  local_290 = local_458;
  uStack_288 = local_460;
  memcpy(local_78,&local_2f8,0xa0);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result, uint8_t *scalar, uint64_t *q1)
{
  uint64_t b[80U] = { 0U };
  uint64_t *nq = b;
  uint64_t *nqpq = b + (uint32_t)20U;
  Hacl_Impl_Ed25519_Ladder_make_point_inf(nq);
  Hacl_Impl_Ed25519_SwapConditional_copy(nqpq, q1);
  Hacl_Impl_Ed25519_Ladder_point_mul_(b, scalar);
  Hacl_Impl_Ed25519_SwapConditional_copy(result, nq);
}